

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O1

CKeyID * __thiscall CPubKey::GetID(CKeyID *__return_storage_ptr__,CPubKey *this)

{
  byte bVar1;
  size_t len;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  uint160 result;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  CSHA256 local_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  len = 0x21;
  if ((this->vch[0] & 0xfe) != 2) {
    bVar1 = this->vch[0] - 4;
    if (bVar1 < 4) {
      len = (&DAT_00257990)[bVar1];
    }
    else {
      len = 0;
    }
  }
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  local_98.buf[0x30] = '\0';
  local_98.buf[0x31] = '\0';
  local_98.buf[0x32] = '\0';
  local_98.buf[0x33] = '\0';
  local_98.buf[0x34] = '\0';
  local_98.buf[0x35] = '\0';
  local_98.buf[0x36] = '\0';
  local_98.buf[0x37] = '\0';
  local_98.buf[0x38] = '\0';
  local_98.buf[0x39] = '\0';
  local_98.buf[0x3a] = '\0';
  local_98.buf[0x3b] = '\0';
  local_98.buf[0x3c] = '\0';
  local_98.buf[0x3d] = '\0';
  local_98.buf[0x3e] = '\0';
  local_98.buf[0x3f] = '\0';
  local_98.buf[0x20] = '\0';
  local_98.buf[0x21] = '\0';
  local_98.buf[0x22] = '\0';
  local_98.buf[0x23] = '\0';
  local_98.buf[0x24] = '\0';
  local_98.buf[0x25] = '\0';
  local_98.buf[0x26] = '\0';
  local_98.buf[0x27] = '\0';
  local_98.buf[0x28] = '\0';
  local_98.buf[0x29] = '\0';
  local_98.buf[0x2a] = '\0';
  local_98.buf[0x2b] = '\0';
  local_98.buf[0x2c] = '\0';
  local_98.buf[0x2d] = '\0';
  local_98.buf[0x2e] = '\0';
  local_98.buf[0x2f] = '\0';
  local_98.buf[0x10] = '\0';
  local_98.buf[0x11] = '\0';
  local_98.buf[0x12] = '\0';
  local_98.buf[0x13] = '\0';
  local_98.buf[0x14] = '\0';
  local_98.buf[0x15] = '\0';
  local_98.buf[0x16] = '\0';
  local_98.buf[0x17] = '\0';
  local_98.buf[0x18] = '\0';
  local_98.buf[0x19] = '\0';
  local_98.buf[0x1a] = '\0';
  local_98.buf[0x1b] = '\0';
  local_98.buf[0x1c] = '\0';
  local_98.buf[0x1d] = '\0';
  local_98.buf[0x1e] = '\0';
  local_98.buf[0x1f] = '\0';
  local_98.buf[0] = '\0';
  local_98.buf[1] = '\0';
  local_98.buf[2] = '\0';
  local_98.buf[3] = '\0';
  local_98.buf[4] = '\0';
  local_98.buf[5] = '\0';
  local_98.buf[6] = '\0';
  local_98.buf[7] = '\0';
  local_98.buf[8] = '\0';
  local_98.buf[9] = '\0';
  local_98.buf[10] = '\0';
  local_98.buf[0xb] = '\0';
  local_98.buf[0xc] = '\0';
  local_98.buf[0xd] = '\0';
  local_98.buf[0xe] = '\0';
  local_98.buf[0xf] = '\0';
  local_98.s[4] = 0;
  local_98.s[5] = 0;
  local_98.s[6] = 0;
  local_98.s[7] = 0;
  local_98.s[0] = 0;
  local_98.s[1] = 0;
  local_98.s[2] = 0;
  local_98.s[3] = 0;
  local_98.bytes = 0;
  CSHA256::CSHA256(&local_98);
  CSHA256::Write(&local_98,this->vch,len);
  output.m_size = 0x14;
  output.m_data = (uchar *)&local_b8;
  CHash160::Finalize((CHash160 *)&local_98,output);
  *(undefined4 *)
   ((__return_storage_ptr__->super_uint160).super_base_blob<160U>.m_data._M_elems + 0x10) = local_a8
  ;
  *(undefined4 *)(__return_storage_ptr__->super_uint160).super_base_blob<160U>.m_data._M_elems =
       (undefined4)local_b8;
  *(undefined4 *)((__return_storage_ptr__->super_uint160).super_base_blob<160U>.m_data._M_elems + 4)
       = local_b8._4_4_;
  *(undefined4 *)((__return_storage_ptr__->super_uint160).super_base_blob<160U>.m_data._M_elems + 8)
       = (undefined4)uStack_b0;
  *(undefined4 *)
   ((__return_storage_ptr__->super_uint160).super_base_blob<160U>.m_data._M_elems + 0xc) =
       uStack_b0._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CKeyID GetID() const
    {
        return CKeyID(Hash160(Span{vch}.first(size())));
    }